

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::LightHandle::L
          (LightHandle *this,Point3f p,Normal3f n,Point2f uv,Vector3f w,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined8 in_XMM2_Qb;
  undefined8 in_XMM4_Qb;
  undefined8 in_XMM5_Qb;
  SampledSpectrum SVar5;
  DispatchSplit<9> local_69;
  undefined8 local_68;
  float local_60;
  Point2f uv_local;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  undefined8 *local_30;
  undefined8 *puStack_28;
  Point2f *pPStack_20;
  undefined8 *puStack_18;
  SampledWavelengths *local_10;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_8;
  
  local_60 = w.super_Tuple3<pbrt::Vector3,_float>.z;
  local_48 = n.super_Tuple3<pbrt::Normal3,_float>.z;
  local_38 = p.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._8_56_ = p._8_56_;
  auVar4._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_40 = vmovlps_avx(auVar4._0_16_);
  auVar1._8_8_ = in_XMM2_Qb;
  auVar1._0_8_ = n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  local_50 = vmovlps_avx(auVar1);
  auVar3._8_8_ = in_XMM5_Qb;
  auVar3._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_68 = vmovlps_avx(auVar3);
  auVar2._8_8_ = in_XMM4_Qb;
  auVar2._0_8_ = uv.super_Tuple2<pbrt::Point2,_float>;
  uv_local.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar2);
  local_8.bits = (this->
                 super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                 ).bits;
  if (*(int *)(local_8.bits & 0xffffffffffff) == 2) {
    local_30 = &local_40;
    puStack_28 = &local_50;
    pPStack_20 = &uv_local;
    puStack_18 = &local_68;
    local_10 = lambda;
    SVar5 = DispatchSplit<9>::operator()(&local_69,&local_8,local_8.bits >> 0x30);
    return (array<float,_4>)(array<float,_4>)SVar5;
  }
  LogFatal<char_const(&)[26]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.h"
             ,0x2f4,"Check failed: %s",(char (*) [26])"Type() == LightType::Area");
}

Assistant:

inline SampledSpectrum LightHandle::L(Point3f p, Normal3f n, Point2f uv, Vector3f w,
                                      const SampledWavelengths &lambda) const {
    CHECK(Type() == LightType::Area);
    auto l = [&](auto ptr) { return ptr->L(p, n, uv, w, lambda); };
    return Dispatch(l);
}